

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# entropy_calculation.cc
# Opt level: O3

bool __thiscall
sptk::EntropyCalculation::Run
          (EntropyCalculation *this,vector<double,_std::allocator<double>_> *probability,
          double *entropy)

{
  double dVar1;
  int iVar2;
  EntropyUnits EVar3;
  pointer pdVar4;
  double dVar5;
  long lVar6;
  double dVar7;
  
  if (this->is_valid_ != true) {
    return false;
  }
  if (entropy == (double *)0x0) {
    return false;
  }
  pdVar4 = (probability->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_start;
  iVar2 = this->num_element_;
  if ((long)(probability->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
            super__Vector_impl_data._M_finish - (long)pdVar4 >> 3 != (long)iVar2) {
    return false;
  }
  EVar3 = this->entropy_unit_;
  if (EVar3 == kBit) {
    if (0 < iVar2) {
      dVar7 = 0.0;
      lVar6 = 0;
      do {
        dVar1 = pdVar4[lVar6];
        dVar5 = FloorLog2(dVar1);
        dVar7 = dVar7 + dVar5 * dVar1;
        lVar6 = lVar6 + 1;
      } while (lVar6 < this->num_element_);
      goto LAB_00105493;
    }
  }
  else if (EVar3 == kNat) {
    if (0 < iVar2) {
      dVar7 = 0.0;
      lVar6 = 0;
      do {
        dVar1 = pdVar4[lVar6];
        dVar5 = FloorLog(dVar1);
        dVar7 = dVar7 + dVar5 * dVar1;
        lVar6 = lVar6 + 1;
      } while (lVar6 < this->num_element_);
      goto LAB_00105493;
    }
  }
  else {
    if (EVar3 != kDit) {
      return false;
    }
    if (0 < iVar2) {
      dVar7 = 0.0;
      lVar6 = 0;
      do {
        dVar1 = pdVar4[lVar6];
        dVar5 = FloorLog10(dVar1);
        dVar7 = dVar7 + dVar5 * dVar1;
        lVar6 = lVar6 + 1;
      } while (lVar6 < this->num_element_);
      goto LAB_00105493;
    }
  }
  dVar7 = 0.0;
LAB_00105493:
  *entropy = -dVar7;
  return true;
}

Assistant:

bool EntropyCalculation::Run(const std::vector<double>& probability,
                             double* entropy) const {
  if (!is_valid_ ||
      probability.size() != static_cast<std::size_t>(num_element_) ||
      NULL == entropy) {
    return false;
  }

  const double* p(&(probability[0]));
  double sum(0.0);

  switch (entropy_unit_) {
    case kBit: {
      for (int i(0); i < num_element_; ++i) {
        sum += p[i] * FloorLog2(p[i]);
      }
      break;
    }
    case kNat: {
      for (int i(0); i < num_element_; ++i) {
        sum += p[i] * FloorLog(p[i]);
      }
      break;
    }
    case kDit: {
      for (int i(0); i < num_element_; ++i) {
        sum += p[i] * FloorLog10(p[i]);
      }
      break;
    }
    default: {
      return false;
    }
  }

  *entropy = -sum;

  return true;
}